

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O2

void disruptor::test::BusySpinStrategy::SignalAlertWaitingOnDependents_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  basic_wrap_stringstream<char> local_418;
  pointer local_280;
  pointer local_278;
  pointer local_270;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  pointer local_250;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  SignalAlertWaitingOnDependents t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_420 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"SignalAlertWaitingOnDependents");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_240 = (pbVar2->_M_dataplus)._M_p;
  local_238 = local_240 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_428,0x79);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.cursor.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_1.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_2.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.sequence_3.sequence_.super___atomic_base<long>._M_i =
       (__atomic_base<long>)-1;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.strategy._vptr_BusySpinStrategy =
       (_func_int **)&PTR_SignalAllWhenBlocking_00119588;
  t.super_BOOST_AUTO_TEST_CASE_FIXTURE.alerted._M_base._M_i = (__atomic_base<bool>)false;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_430 = "";
  memset(&local_418,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_418);
  std::operator<<((ostream *)&local_418,'\"');
  std::operator<<((ostream *)&local_418,"SignalAlertWaitingOnDependents");
  std::operator<<((ostream *)&local_418,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_418);
  local_250 = (pbVar2->_M_dataplus)._M_p;
  local_248 = local_250 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_438,0x79);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_418);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_440 = "";
  memset(&local_418,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_418);
  std::operator<<((ostream *)&local_418,'\"');
  std::operator<<((ostream *)&local_418,"SignalAlertWaitingOnDependents");
  std::operator<<((ostream *)&local_418,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_418);
  local_260 = (pbVar2->_M_dataplus)._M_p;
  local_258 = local_260 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_448,0x79);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_418);
  SignalAlertWaitingOnDependents::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_450 = "";
  memset(&local_418,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_418);
  std::operator<<((ostream *)&local_418,'\"');
  std::operator<<((ostream *)&local_418,"SignalAlertWaitingOnDependents");
  std::operator<<((ostream *)&local_418,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_418);
  local_270 = (pbVar2->_M_dataplus)._M_p;
  local_268 = local_270 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_458,0x79);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_418);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_460 = "";
  memset(&local_418,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_418);
  std::operator<<((ostream *)&local_418,'\"');
  std::operator<<((ostream *)&local_418,"SignalAlertWaitingOnDependents");
  std::operator<<((ostream *)&local_418,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_418);
  local_280 = (pbVar2->_M_dataplus)._M_p;
  local_278 = local_280 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_468,0x79);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_418);
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&t.super_BOOST_AUTO_TEST_CASE_FIXTURE.dependents.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalAlertWaitingOnDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  alerted.store(true);

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kAlertedSignal);
}